

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void * xmlXPathPopExternal(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  xmlXPathObjectPtr pxVar4;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    xmlXPathErr((xmlXPathParserContextPtr)0x0,10);
  }
  else if (ctxt->value == (xmlXPathObjectPtr)0x0) {
    xmlXPathErr(ctxt,10);
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 10;
    }
  }
  else {
    if (ctxt->value->type == XPATH_USERS) {
      iVar1 = ctxt->valueNr;
      lVar3 = (long)iVar1;
      if (lVar3 < 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        ctxt->valueNr = iVar1 + -1;
        if (iVar1 == 1) {
          pxVar4 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar4 = ctxt->valueTab[lVar3 + -2];
        }
        ctxt->value = pxVar4;
        pxVar4 = ctxt->valueTab[lVar3 + -1];
        ctxt->valueTab[lVar3 + -1] = (xmlXPathObjectPtr)0x0;
      }
      pvVar2 = pxVar4->user;
      pxVar4->user = (void *)0x0;
      xmlXPathReleaseObject(ctxt->context,pxVar4);
      return pvVar2;
    }
    xmlXPathErr(ctxt,0xb);
    ctxt->error = 0xb;
  }
  return (void *)0x0;
}

Assistant:

void *
xmlXPathPopExternal (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    void * ret;

    if ((ctxt == NULL) || (ctxt->value == NULL)) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(NULL);
    }
    if (ctxt->value->type != XPATH_USERS) {
	xmlXPathSetTypeError(ctxt);
	return(NULL);
    }
    obj = xmlXPathValuePop(ctxt);
    ret = obj->user;
    obj->user = NULL;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}